

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseType(ParseContext *ctx,bool *shrBorrow,bool onlyType)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  SynBase *pSVar4;
  undefined4 extraout_var;
  SynBase *pSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar6;
  Lexeme *end;
  uint uVar7;
  undefined7 in_register_00000011;
  bool *value;
  Lexeme *pLVar8;
  uint uVar9;
  uint *key;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this;
  int iVar10;
  bool shrBorrowTerminal;
  IntrusiveList<SynBase> sizes;
  bool local_91;
  Lexeme *local_90;
  bool local_81;
  undefined4 local_80;
  uint local_7c;
  SynBase *local_78;
  SynBase *pSStack_70;
  SynBase *local_68;
  SynBase *pSStack_60;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *local_50;
  SynBase *local_48;
  SynBase *pSStack_40;
  
  local_90 = ctx->currentLexeme;
  uVar3 = (ctx->nonTypeLocations).bucketCount;
  uVar6 = uVar3 - 1;
  if (uVar3 != 0) {
    uVar7 = (int)((ulong)((long)local_90 - (long)ctx->firstLexeme) >> 5) + 1;
    uVar9 = uVar7 * -0x61c88647;
    iVar10 = 0;
    do {
      uVar9 = uVar9 & uVar6;
      uVar1 = (ctx->nonTypeLocations).data[uVar9].key;
      if (uVar1 == 0) break;
      if (uVar1 == uVar7) {
        return (SynBase *)0x0;
      }
      uVar9 = uVar9 + iVar10 + 1;
      iVar10 = iVar10 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (shrBorrow == (bool *)0x0) {
    local_91 = false;
  }
  else {
    local_91 = *shrBorrow;
  }
  pSVar4 = ParseTerminalType(ctx,&local_91);
  if (pSVar4 == (SynBase *)0x0) {
    return (SynBase *)0x0;
  }
  this = &ctx->nonTypeLocations;
  if (local_91 == true) {
    if (shrBorrow == (bool *)0x0) {
      ctx->currentLexeme = local_90;
      key = (uint *)&local_78;
      local_78 = (SynBase *)
                 CONCAT44(local_78._4_4_,
                          (int)((ulong)((long)local_90 - (long)ctx->firstLexeme) >> 5) + 1);
      value = (bool *)&local_7c;
      local_7c = CONCAT31(local_7c._1_3_,1);
LAB_00215585:
      SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert(this,key,value);
      return (SynBase *)0x0;
    }
    *shrBorrow = true;
  }
  local_80 = (undefined4)CONCAT71(in_register_00000011,onlyType);
  local_50 = this;
  do {
    while( true ) {
      while( true ) {
        pLVar8 = ctx->currentLexeme;
        if (pLVar8->type == lex_ref) break;
        if (pLVar8->type != lex_obracket) {
          return pSVar4;
        }
        local_78 = (SynBase *)0x0;
        pSStack_70 = (SynBase *)0x0;
        local_68 = pSVar4;
        while (pLVar8->type == lex_obracket) {
          ctx->currentLexeme = pLVar8 + 1;
          pSVar4 = ParseTernaryExpr(ctx);
          if (pSVar4 == (SynBase *)0x0) {
            bVar2 = anon_unknown.dwarf_169315::CheckConsume
                              (ctx,lex_cbracket,"ERROR: matching \']\' not found");
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pSVar4 = (SynBase *)CONCAT44(extraout_var,iVar10);
            end = ctx->currentLexeme;
            if (bVar2) {
              if (end <= ctx->firstLexeme) goto LAB_002155f0;
              end = end + -1;
            }
            SynBase::SynBase(pSVar4,3,pLVar8 + 1,end);
            pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e76c0;
          }
          else {
            if (ctx->currentLexeme->type != lex_cbracket) {
              if ((char)local_80 != '\0') {
                anon_unknown.dwarf_169315::Report
                          (ctx,ctx->currentLexeme,"ERROR: \']\' not found after expression");
              }
              ctx->currentLexeme = local_90;
              local_7c = (int)((ulong)((long)local_90 - (long)ctx->firstLexeme) >> 5) + 1;
              key = &local_7c;
              value = &local_81;
              local_81 = true;
              this = local_50;
              goto LAB_00215585;
            }
            anon_unknown.dwarf_169315::CheckConsume
                      (ctx,lex_cbracket,"ERROR: matching \']\' not found");
          }
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&local_78,pSVar4);
          pLVar8 = ctx->currentLexeme;
        }
        iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pSVar4 = (SynBase *)CONCAT44(extraout_var_01,iVar10);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002155f0;
        local_48 = local_78;
        pSStack_40 = pSStack_70;
        SynBase::SynBase(pSVar4,9,local_90,ctx->currentLexeme + -1);
        pSVar4->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e76f8;
        pSVar4[1]._vptr_SynBase = (_func_int **)local_68;
        *(SynBase **)&pSVar4[1].typeID = local_48;
        pSVar4[1].begin = (Lexeme *)pSStack_40;
      }
      ctx->currentLexeme = pLVar8 + 1;
      if (pLVar8[1].type == lex_oparen) break;
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar5 = (SynBase *)CONCAT44(extraout_var_02,iVar10);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002155f0;
      SynBase::SynBase(pSVar5,10,local_90,ctx->currentLexeme + -1);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6b00;
      pSVar5[1]._vptr_SynBase = (_func_int **)pSVar4;
      pSVar4 = pSVar5;
    }
    ctx->currentLexeme = pLVar8 + 2;
    local_78 = (SynBase *)0x0;
    pSStack_70 = (SynBase *)0x0;
    pSVar5 = ParseType(ctx,(bool *)0x0,false);
    if (pSVar5 != (SynBase *)0x0) {
      do {
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&local_78,pSVar5);
        if (ctx->currentLexeme->type != lex_comma) goto LAB_002153da;
        ctx->currentLexeme = ctx->currentLexeme + 1;
        pSVar5 = ParseType(ctx,(bool *)0x0,false);
      } while (pSVar5 != (SynBase *)0x0);
      anon_unknown.dwarf_169315::Report
                (ctx,ctx->currentLexeme,"ERROR: type is expected after \',\'");
    }
LAB_002153da:
    if (ctx->currentLexeme->type != lex_cparen) {
      ctx->currentLexeme = pLVar8 + 1;
      iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar5 = (SynBase *)CONCAT44(extraout_var_03,iVar10);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(pSVar5,10,local_90,ctx->currentLexeme + -1);
        pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6b00;
        pSVar5[1]._vptr_SynBase = (_func_int **)pSVar4;
        return pSVar5;
      }
LAB_002155f0:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    pSVar5 = (SynBase *)CONCAT44(extraout_var_00,iVar10);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002155f0;
    local_68 = local_78;
    pSStack_60 = pSStack_70;
    SynBase::SynBase(pSVar5,0xb,local_90,ctx->currentLexeme + -1);
    pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e7730;
    pSVar5[1]._vptr_SynBase = (_func_int **)pSVar4;
    *(SynBase **)&pSVar5[1].typeID = local_68;
    pSVar5[1].begin = (Lexeme *)pSStack_60;
    pSVar4 = pSVar5;
  } while( true );
}

Assistant:

SynBase* ParseType(ParseContext &ctx, bool *shrBorrow, bool onlyType)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonTypeLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool shrBorrowTerminal = shrBorrow ? *shrBorrow : false;

	SynBase *base = ParseTerminalType(ctx, shrBorrowTerminal);
	
	if(!base)
		return NULL;

	if(shrBorrowTerminal)
	{
		if(!shrBorrow)
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}
		else
		{
			*shrBorrow = true;
		}
	}

	while(ctx.At(lex_obracket) || ctx.At(lex_ref))
	{
		if(ctx.At(lex_obracket))
		{
			IntrusiveList<SynBase> sizes;

			while(ctx.Consume(lex_obracket))
			{
				Lexeme *sizeStart = ctx.currentLexeme;

				SynBase *size = ParseTernaryExpr(ctx);

				if(size && !ctx.At(lex_cbracket))
				{
					if(onlyType)
						Report(ctx, ctx.Current(), "ERROR: ']' not found after expression");

					// Backtrack
					ctx.currentLexeme = start;
					ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

					return NULL;
				}

				bool hasClose = CheckConsume(ctx, lex_cbracket, "ERROR: matching ']' not found");

				if(size)
					sizes.push_back(size);
				else
					sizes.push_back(new (ctx.get<SynNothing>()) SynNothing(sizeStart, hasClose ? ctx.Previous() : ctx.Current()));
			}

			base = new (ctx.get<SynTypeArray>()) SynTypeArray(start, ctx.Previous(), base, sizes);
		}
		else if(ctx.Consume(lex_ref))
		{
			Lexeme *refLexeme = ctx.currentLexeme;

			if(ctx.Consume(lex_oparen))
			{
				IntrusiveList<SynBase> arguments;

				if(SynBase *argument = ParseType(ctx))
				{
					arguments.push_back(argument);

					while(ctx.Consume(lex_comma))
					{
						argument = ParseType(ctx);

						if(!argument)
						{
							Report(ctx, ctx.Current(), "ERROR: type is expected after ','");

							break;
						}

						arguments.push_back(argument);
					}
				}

				if(!ctx.Consume(lex_cparen))
				{
					// Backtrack
					ctx.currentLexeme = refLexeme;

					return new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
				}

				base = new (ctx.get<SynTypeFunction>()) SynTypeFunction(start, ctx.Previous(), base, arguments);
			}
			else
			{
				base = new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
			}
		}
	}

	return base;
}